

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_highbd_v_predictor_8x32_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  int iVar2;
  
  iVar2 = 0x20;
  do {
    uVar1 = *(undefined8 *)(above + 4);
    *(undefined8 *)dst = *(undefined8 *)above;
    *(undefined8 *)(dst + 4) = uVar1;
    dst = dst + stride;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

static inline void highbd_v_predictor(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int bd) {
  int r;
  (void)left;
  (void)bd;
  for (r = 0; r < bh; r++) {
    memcpy(dst, above, bw * sizeof(uint16_t));
    dst += stride;
  }
}